

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

bool __thiscall
pybind11::detail::copyable_holder_caster<anurbs::BrepLoop,_std::shared_ptr<anurbs::BrepLoop>_>::
load_value(copyable_holder_caster<anurbs::BrepLoop,_std::shared_ptr<anurbs::BrepLoop>_> *this,
          value_and_holder *v_h)

{
  void **ppvVar1;
  bool bVar2;
  cast_error *this_00;
  allocator<char> local_79;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  bVar2 = value_and_holder::holder_constructed(v_h);
  if (bVar2) {
    ppvVar1 = v_h->vh;
    (this->super_type_caster_base<anurbs::BrepLoop>).super_type_caster_generic.value = *ppvVar1;
    std::__shared_ptr<anurbs::BrepLoop,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->holder).super___shared_ptr<anurbs::BrepLoop,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<anurbs::BrepLoop,_(__gnu_cxx::_Lock_policy)2> *)(ppvVar1 + 1));
    return true;
  }
  this_00 = (cast_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"St10shared_ptrIN6anurbs8BrepLoopEE",&local_79);
  clean_type_id(&local_78);
  std::operator+(&local_58,
                 "Unable to cast from non-held to held instance (T& to Holder<T>) of type \'",
                 &local_78);
  std::operator+(&local_38,&local_58,"\'\'");
  cast_error::runtime_error(this_00,&local_38);
  __cxa_throw(this_00,&cast_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool load_value(value_and_holder &&v_h) {
        if (v_h.holder_constructed()) {
            value = v_h.value_ptr();
            holder = v_h.template holder<holder_type>();
            return true;
        } else {
            throw cast_error("Unable to cast from non-held to held instance (T& to Holder<T>) "
#if defined(NDEBUG)
                             "(compile in debug mode for type information)");
#else
                             "of type '" + type_id<holder_type>() + "''");
#endif
        }
    }